

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void FS_GiveInventory(AActor *actor,char *type,int amount)

{
  int iVar1;
  PClassActor *p;
  PClassInventory *type_00;
  PClassInventory *info;
  char *pcStack_18;
  int amount_local;
  char *type_local;
  AActor *actor_local;
  
  if (0 < amount) {
    iVar1 = strcmp(type,"Armor");
    pcStack_18 = type;
    if (iVar1 == 0) {
      pcStack_18 = "BasicArmorPickup";
    }
    p = PClass::FindActor(pcStack_18);
    type_00 = dyn_cast<PClassInventory>((DObject *)p);
    if (type_00 == (PClassInventory *)0x0) {
      Printf("Unknown inventory item: %s\n",pcStack_18);
    }
    else {
      AActor::GiveInventory(actor,type_00,amount,false);
    }
  }
  return;
}

Assistant:

static void FS_GiveInventory (AActor *actor, const char * type, int amount)
{
	if (amount <= 0)
	{
		return;
	}
	if (strcmp (type, "Armor") == 0)
	{
		type = "BasicArmorPickup";
	}
	PClassInventory * info = dyn_cast<PClassInventory>(PClass::FindActor (type));
	if (info == NULL)
	{
		Printf ("Unknown inventory item: %s\n", type);
		return;
	}

	actor->GiveInventory(info, amount);
}